

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> * __thiscall
tinyusdz::lerp<std::array<double,3ul>>
          (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *a,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *b,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  pointer paVar6;
  pointer paVar7;
  ulong uVar8;
  long lVar9;
  ulong __new_size;
  double dVar10;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
  __new_size = ((long)(a->
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(a->
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar8 <= __new_size) {
    __new_size = uVar8;
  }
  if (__new_size != 0) {
    ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      dVar10 = 1.0 - t;
      lVar9 = 0x10;
      do {
        lVar5 = *(long *)this;
        paVar6 = (a->
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar1 = *(double *)(lVar5 + -8 + lVar9);
        dVar2 = *(double *)(lVar5 + lVar9);
        dVar3 = *(double *)((long)paVar6->_M_elems + lVar9 + -8);
        dVar4 = *(double *)((long)paVar6->_M_elems + lVar9);
        paVar7 = (__return_storage_ptr__->
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)paVar7->_M_elems + lVar9 + -0x10) =
             *(double *)((long)paVar6->_M_elems + lVar9 + -0x10) * t +
             *(double *)(lVar5 + -0x10 + lVar9) * dVar10;
        *(double *)((long)paVar7->_M_elems + lVar9 + -8) = dVar3 * t + dVar1 * dVar10;
        *(double *)((long)paVar7->_M_elems + lVar9) = dVar4 * t + dVar2 * dVar10;
        lVar9 = lVar9 + 0x18;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}